

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE pRVar1;
  REF_INTERP pRVar2;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_NODE ref_node;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  undefined8 uVar15;
  char *pcVar16;
  long lVar17;
  double dVar18;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  int local_270;
  REF_INT nnode;
  REF_INTERP local_268;
  double local_260;
  long local_258;
  REF_DBL quality0;
  REF_DBL local_248;
  undefined8 uStack_240;
  double local_238;
  undefined8 uStack_230;
  REF_DBL original [3];
  REF_DBL ideal [3];
  REF_DBL local_1e8 [4];
  REF_DBL quality;
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->interp;
  if ((node < 0) ||
     ((((((pRVar3 = ref_grid->cell[3]->ref_adj, pRVar3->nnode <= node ||
          (pRVar3->first[(uint)node] == -1)) &&
         ((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= node ||
          (pRVar3->first[(uint)node] == -1)))) &&
        ((pRVar3 = ref_grid->cell[9]->ref_adj, pRVar3->nnode <= node ||
         (pRVar3->first[(uint)node] == -1)))) &&
       ((pRVar3 = ref_grid->cell[10]->ref_adj, pRVar3->nnode <= node ||
        (pRVar3->first[(uint)node] == -1)))) &&
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, pRVar3->nnode <= node ||
       (pRVar3->first[(uint)node] == -1)))))) {
    lVar17 = (long)(node * 0xf);
    pRVar4 = pRVar1->real;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      original[lVar14] = pRVar4[lVar17 + lVar14];
    }
    iVar9 = -1;
    local_258 = (long)node;
    if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
      iVar9 = pRVar2->cell[local_258];
    }
    uVar10 = ref_smooth_tet_quality_around(ref_grid,node,&quality0);
    if (uVar10 == 0) {
      uVar10 = ref_smooth_tet_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
      if (uVar10 == 0) {
        local_248 = quality0;
        uStack_240 = 0;
        bVar5 = min_ratio <= 0.5;
        bVar6 = 2.0 <= max_ratio;
        local_268 = pRVar2;
        if (bVar6 || (bVar5 || quality0 <= 0.5)) {
          uVar10 = ref_smooth_tet_weighted_ideal(ref_grid,node,ideal);
          if (uVar10 == 0) {
LAB_001c07da:
            local_238 = local_248 * 0.9;
            uStack_230 = 0;
            dVar18 = 1.0;
            uVar10 = 0;
            iVar13 = 0;
            while (iVar13 != 8) {
              pRVar4 = pRVar1->real;
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                pRVar4[lVar17 + lVar14] = ideal[lVar14] * dVar18 + original[lVar14] * (1.0 - dVar18)
                ;
              }
              local_270 = iVar13;
              local_260 = dVar18;
              uVar11 = ref_metric_interpolate_node(ref_grid,node);
              if ((uVar11 != 0) && (uVar11 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x5ca,"ref_smooth_tet_improve",(ulong)uVar11,
                       "ref_metric_interpolate_node failed");
                uVar10 = uVar11;
              }
              if ((uVar11 != 5) && (uVar11 != 0)) {
                return uVar10;
              }
              uVar12 = ref_smooth_tet_quality_around(ref_grid,node,&quality);
              if (uVar12 != 0) {
                pcVar16 = "q";
                uVar15 = 0x5cb;
LAB_001c0a66:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar15,"ref_smooth_tet_improve",(ulong)uVar12,pcVar16);
                return uVar12;
              }
              uVar12 = ref_smooth_tet_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
              if (uVar12 != 0) {
                pcVar16 = "ratio";
                uVar15 = 0x5cd;
                goto LAB_001c0a66;
              }
              if (uVar11 == 0) {
                if (ref_grid->adapt->post_min_ratio <= min_ratio) {
                  bVar8 = max_ratio <= ref_grid->adapt->post_max_ratio;
                }
                else {
                  bVar8 = false;
                }
              }
              else {
                bVar8 = false;
              }
              if (bVar6 || (bVar5 || quality0 <= 0.5)) {
                bVar7 = local_248 < quality;
              }
              else {
                bVar7 = local_238 < quality && 0.4 < quality;
              }
              if ((bool)(bVar8 & bVar7)) goto LAB_001c0537;
              dVar18 = local_260 * 0.5;
              if (uVar11 != 0 && iVar9 != -1) {
                local_268->cell[local_258] = iVar9;
              }
              iVar13 = local_270 + 1;
            }
            pRVar4 = pRVar1->real;
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              pRVar4[lVar17 + lVar14] = original[lVar14];
            }
            uVar11 = ref_metric_interpolate_node(ref_grid,node);
            if ((uVar11 != 0) && (uVar11 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x5e1,"ref_smooth_tet_improve",(ulong)uVar11,"interp");
              uVar10 = uVar11;
            }
            if ((uVar11 != 5) && (uVar11 != 0)) {
              return uVar10;
            }
            goto LAB_001c0537;
          }
          pcVar16 = "ideal";
          uVar15 = 0x5c2;
        }
        else {
          ref_node = ref_grid->node;
          uVar10 = ref_cell_node_list_around(ref_grid->cell[8],node,100,&nnode,(REF_INT *)&quality);
          if (uVar10 == 0) {
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              local_1e8[lVar14] = 0.0;
            }
            lVar14 = 0;
            do {
              if (nnode <= lVar14) {
                pRVar4 = ref_node->real;
                dVar18 = ref_grid->adapt->smooth_pliant_alpha;
                for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                  ideal[lVar14] = local_1e8[lVar14] * dVar18 + pRVar4[lVar17 + lVar14];
                }
                goto LAB_001c07da;
              }
              uVar10 = ref_smooth_add_pliant_force
                                 (ref_node,node,*(REF_INT *)((long)&quality + lVar14 * 4),local_1e8)
              ;
              lVar14 = lVar14 + 1;
            } while (uVar10 == 0);
            pcVar16 = "edge";
            uVar15 = 0x58f;
          }
          else {
            pcVar16 = "node list for pliant tet edges";
            uVar15 = 0x589;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 uVar15,"ref_smooth_tet_pliant",(ulong)uVar10,pcVar16);
          pcVar16 = "pliant";
          uVar15 = 0x5c0;
        }
      }
      else {
        pcVar16 = "ratio";
        uVar15 = 0x5bc;
      }
    }
    else {
      pcVar16 = "q";
      uVar15 = 0x5ba;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar15
           ,"ref_smooth_tet_improve",(ulong)uVar10,pcVar16);
  }
  else {
LAB_001c0537:
    uVar10 = 0;
  }
  return uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT tries;
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, quality0, quality, min_ratio, max_ratio;
  REF_INT ixyz;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing;
  REF_BOOL accept;

  /* can't handle boundaries yet */
  if (!ref_cell_node_empty(ref_grid_tri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_qua(ref_grid), node))
    return REF_SUCCESS;

  /* can't mixed elements */
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_pri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_hex(ref_grid), node))
    return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality0), "q");
  RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (quality0 > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);

  if (pliant_smoothing) {
    RSS(ref_smooth_tet_pliant(ref_grid, node, ideal), "pliant");
  } else {
    RSS(ref_smooth_tet_weighted_ideal(ref_grid, node, ideal), "ideal");
  }
  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality), "q");
    RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
        "ratio");
    accept = (REF_SUCCESS == interp_status);
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (quality > 0.9 * quality0);
      accept = accept && (quality > 0.4);
    } else {
      accept = accept && (quality > quality0);
    }
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}